

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O3

void __thiscall cmMakefile::AddInstallGenerator(cmMakefile *this,cmInstallGenerator *g)

{
  pointer *pppcVar1;
  iterator __position;
  cmInstallGenerator *local_8;
  
  if (g != (cmInstallGenerator *)0x0) {
    __position._M_current =
         (this->InstallGenerators).
         super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->InstallGenerators).
        super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_8 = g;
      std::vector<cmInstallGenerator*,std::allocator<cmInstallGenerator*>>::
      _M_realloc_insert<cmInstallGenerator*const&>
                ((vector<cmInstallGenerator*,std::allocator<cmInstallGenerator*>> *)
                 &this->InstallGenerators,__position,&local_8);
    }
    else {
      *__position._M_current = g;
      pppcVar1 = &(this->InstallGenerators).
                  super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  return;
}

Assistant:

void AddInstallGenerator(cmInstallGenerator* g)
  {
    if (g) {
      this->InstallGenerators.push_back(g);
    }
  }